

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

Index __thiscall
MADPComponentDiscreteObservations::IndividualToJointObservationIndices
          (MADPComponentDiscreteObservations *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivObservationIndices)

{
  Index IVar1;
  ostream *poVar2;
  E *this_00;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized != false) {
    IVar1 = IndexTools::IndividualToJointIndicesStepSize
                      (indivObservationIndices,this->_m_observationStepSize);
    return IVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_188,"MADPComponentDiscreteObservations::GetJointObservationIndex(")
  ;
  poVar2 = std::operator<<(poVar2,
                           "vector<Index>& indivObservationIndices) - Error: not initialized.");
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentDiscreteObservations::IndividualToJointObservationIndices(
    const vector<Index>& indivObservationIndices)const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss <<  "MADPComponentDiscreteObservations::GetJointObservationIndex("<<
           "vector<Index>& indivObservationIndices) - Error: not initialized."
            <<endl;
        throw E(ss);
    }
    Index i = IndexTools::IndividualToJointIndicesStepSize(
            indivObservationIndices, _m_observationStepSize);

    return(i);
}